

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvbios.c
# Opt level: O0

void find_strap(char *filename)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcStack_28;
  int base_length;
  char *pos;
  char *strap_filename;
  char *path;
  char *filename_local;
  
  pcVar2 = strrchr(filename,0x2f);
  pcStack_28 = filename;
  if (pcVar2 != (char *)0x0) {
    pcStack_28 = pcVar2 + 1;
  }
  iVar1 = (int)pcStack_28 - (int)filename;
  sVar3 = strlen("strap_peek");
  pcVar2 = (char *)malloc((long)iVar1 + sVar3 + 1);
  strncpy(pcVar2,filename,(long)iVar1);
  sVar3 = strlen("strap_peek");
  strncpy(pcVar2 + iVar1,"strap_peek",sVar3 + 1);
  iVar1 = set_strap_from_file(pcVar2);
  if (iVar1 == 0) {
    printf("Strap register found in \'%s\'\n",pcVar2);
  }
  free(pcVar2);
  return;
}

Assistant:

void find_strap(char *filename) {
	char *path;
	const char * strap_filename = "strap_peek";
	const char *pos = strrchr(filename, '/');
	if (pos == NULL)
		pos = filename;
	else
		pos++;
	int base_length = pos-filename;

	path = (char*) malloc(base_length + strlen(strap_filename)+1);
	strncpy(path, filename, base_length);
	strncpy(path+base_length, strap_filename, strlen(strap_filename)+1);

	if (!set_strap_from_file(path))
		printf("Strap register found in '%s'\n", path);

	free(path);
}